

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  int iVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  ImDrawList *this_00;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  ImDrawVert *__dest_01;
  int iVar6;
  
  this_00 = (ImDrawList *)ImGui::MemAlloc(0xa8);
  ImDrawList(this_00,(ImDrawListSharedData *)0x0);
  pIVar3 = (this_00->CmdBuffer).Data;
  if (pIVar3 != (ImDrawCmd *)0x0) {
    (this_00->CmdBuffer).Size = 0;
    (this_00->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar3);
    (this_00->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  iVar1 = (this->CmdBuffer).Size;
  iVar2 = (this_00->CmdBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= iVar1) {
      iVar6 = iVar1;
    }
    if (iVar2 < iVar6) {
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar6 * 0x30);
      pIVar3 = (this_00->CmdBuffer).Data;
      if (pIVar3 != (ImDrawCmd *)0x0) {
        memcpy(__dest,pIVar3,(long)(this_00->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this_00->CmdBuffer).Data);
      }
      (this_00->CmdBuffer).Data = __dest;
      (this_00->CmdBuffer).Capacity = iVar6;
    }
  }
  (this_00->CmdBuffer).Size = iVar1;
  memcpy((this_00->CmdBuffer).Data,(this->CmdBuffer).Data,(long)iVar1 * 0x30);
  puVar4 = (this_00->IdxBuffer).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this_00->IdxBuffer).Size = 0;
    (this_00->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this_00->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar1 = (this->IdxBuffer).Size;
  iVar2 = (this_00->IdxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= iVar1) {
      iVar6 = iVar1;
    }
    if (iVar2 < iVar6) {
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar6 * 2);
      puVar4 = (this_00->IdxBuffer).Data;
      if (puVar4 != (unsigned_short *)0x0) {
        memcpy(__dest_00,puVar4,(long)(this_00->IdxBuffer).Size * 2);
        ImGui::MemFree((this_00->IdxBuffer).Data);
      }
      (this_00->IdxBuffer).Data = __dest_00;
      (this_00->IdxBuffer).Capacity = iVar6;
    }
  }
  (this_00->IdxBuffer).Size = iVar1;
  memcpy((this_00->IdxBuffer).Data,(this->IdxBuffer).Data,(long)iVar1 * 2);
  pIVar5 = (this_00->VtxBuffer).Data;
  if (pIVar5 != (ImDrawVert *)0x0) {
    (this_00->VtxBuffer).Size = 0;
    (this_00->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar5);
    (this_00->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar1 = (this->VtxBuffer).Size;
  iVar2 = (this_00->VtxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= iVar1) {
      iVar6 = iVar1;
    }
    if (iVar2 < iVar6) {
      __dest_01 = (ImDrawVert *)ImGui::MemAlloc((long)iVar6 * 0x14);
      pIVar5 = (this_00->VtxBuffer).Data;
      if (pIVar5 != (ImDrawVert *)0x0) {
        memcpy(__dest_01,pIVar5,(long)(this_00->VtxBuffer).Size * 0x14);
        ImGui::MemFree((this_00->VtxBuffer).Data);
      }
      (this_00->VtxBuffer).Data = __dest_01;
      (this_00->VtxBuffer).Capacity = iVar6;
    }
  }
  (this_00->VtxBuffer).Size = iVar1;
  memcpy((this_00->VtxBuffer).Data,(this->VtxBuffer).Data,(long)iVar1 * 0x14);
  this_00->Flags = this->Flags;
  return this_00;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(NULL));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}